

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_NtkMarkCone(Wlc_Ntk_t *p,int iCoId,int Range,int fSeq,int fAllPis)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Wlc_Obj_t *pWVar4;
  Vec_Int_t *vFlops_00;
  int CoId;
  int CiId;
  int i;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vFlops;
  int fAllPis_local;
  int fSeq_local;
  int Range_local;
  int iCoId_local;
  Wlc_Ntk_t *p_local;
  
  Wlc_NtkCleanMarks(p);
  if (fAllPis != 0) {
    for (CoId = 0; iVar1 = Wlc_NtkPiNum(p), CoId < iVar1; CoId = CoId + 1) {
      pWVar4 = Wlc_NtkPi(p,CoId);
      *(ushort *)pWVar4 = *(ushort *)pWVar4 & 0xff7f | 0x80;
    }
  }
  vFlops_00 = Vec_IntAlloc(100);
  for (CoId = 0; iVar1 = Wlc_NtkCoNum(p), CoId < iVar1; CoId = CoId + 1) {
    pWVar4 = Wlc_NtkCo(p,CoId);
    if ((iCoId == -1) || ((iCoId <= CoId && (CoId < iCoId + Range)))) {
      Wlc_NtkMarkCone_rec(p,pWVar4,vFlops_00);
    }
  }
  if (fSeq != 0) {
    for (CoId = 0; iVar1 = Vec_IntSize(vFlops_00), CoId < iVar1; CoId = CoId + 1) {
      iVar1 = Vec_IntEntry(vFlops_00,CoId);
      iVar2 = Wlc_NtkPoNum(p);
      iVar3 = Wlc_NtkPiNum(p);
      pWVar4 = Wlc_NtkCo(p,(iVar2 + iVar1) - iVar3);
      Wlc_NtkMarkCone_rec(p,pWVar4,vFlops_00);
    }
  }
  Vec_IntFree(vFlops_00);
  return;
}

Assistant:

void Wlc_NtkMarkCone( Wlc_Ntk_t * p, int iCoId, int Range, int fSeq, int fAllPis )
{
    Vec_Int_t * vFlops;
    Wlc_Obj_t * pObj;
    int i, CiId, CoId;
    Wlc_NtkCleanMarks( p );
    if ( fAllPis )
    Wlc_NtkForEachPi( p, pObj, i )
        pObj->Mark = 1;
    vFlops = Vec_IntAlloc( 100 );
    Wlc_NtkForEachCo( p, pObj, i )
        if ( iCoId == -1 || (i >= iCoId && i < iCoId + Range) )
            Wlc_NtkMarkCone_rec( p, pObj, vFlops );
    if ( fSeq )
    Vec_IntForEachEntry( vFlops, CiId, i )
    {
        CoId = Wlc_NtkPoNum(p) + CiId - Wlc_NtkPiNum(p);
        Wlc_NtkMarkCone_rec( p, Wlc_NtkCo(p, CoId), vFlops );
    }
    Vec_IntFree( vFlops );
}